

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<Function>::end(QList<Function> *this)

{
  Function *n;
  QArrayDataPointer<Function> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<Function> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<Function> *)0x111679);
  QArrayDataPointer<Function>::operator->(in_RDI);
  n = QArrayDataPointer<Function>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }